

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O0

void Logger::queueError<>(ErrorType type,char *text)

{
  ErrorType type_00;
  char *in_RCX;
  size_t extraout_RDX;
  string_view text_00;
  undefined1 local_38 [8];
  string message;
  char *text_local;
  ErrorType type_local;
  
  message.field_2._8_8_ = text;
  tinyformat::format<>((string *)local_38,text);
  type_00 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
  text_00._M_str = in_RCX;
  text_00._M_len = extraout_RDX;
  queueError((Logger *)(ulong)type,type_00,text_00);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static void queueError(ErrorType type, const char* text, const Args&... args)
	{
		std::string message = tfm::format(text,args...);
		queueError(type,message);
	}